

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImGuiWindow *pIVar1;
  ImGuiColumns *pIVar2;
  ImGuiWindow *window;
  float fVar3;
  float fVar4;
  
  fVar3 = 0.0;
  if (0.0 <= wrap_pos_x) {
    pIVar1 = GImGui->CurrentWindow;
    if ((wrap_pos_x != 0.0) || (NAN(wrap_pos_x))) {
      if (0.0 < wrap_pos_x) {
        wrap_pos_x = wrap_pos_x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
      }
    }
    else {
      wrap_pos_x = (pIVar1->ContentsRegionRect).Max.x;
      pIVar2 = (pIVar1->DC).CurrentColumns;
      if (pIVar2 != (ImGuiColumns *)0x0) {
        fVar3 = (pIVar1->Pos).x;
        fVar4 = GetColumnOffset(pIVar2->Current + 1);
        wrap_pos_x = (fVar4 + fVar3) - (pIVar1->WindowPadding).x;
      }
    }
    fVar3 = wrap_pos_x - pos->x;
    if (fVar3 <= 1.0) {
      fVar3 = 1.0;
    }
  }
  return fVar3;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiWindow* window = GImGui->CurrentWindow;
    if (wrap_pos_x == 0.0f)
        wrap_pos_x = GetWorkRectMax().x;
    else if (wrap_pos_x > 0.0f)
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}